

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::load_param(ConvolutionDepthWise *this,ParamDict *pd)

{
  int iVar1;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  int local_4;
  
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0,0);
  *(int *)&in_RDI[2].data = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,1,0);
  *(int *)((long)&in_RDI[2].data + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0xb,*(int *)((long)&in_RDI[2].data + 4));
  *(int *)&in_RDI[2].refcount = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,2,1);
  *(int *)((long)&in_RDI[2].refcount + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0xc,*(int *)((long)&in_RDI[2].refcount + 4));
  *(int *)&in_RDI[2].elemsize = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,3,1);
  *(int *)((long)&in_RDI[2].elemsize + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0xd,*(int *)((long)&in_RDI[2].elemsize + 4));
  in_RDI[2].packing = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,4,0);
  *(int *)&in_RDI[2].field_0x1c = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,0xe,*(int *)&in_RDI[2].field_0x1c);
  *(int *)&in_RDI[2].allocator = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,5,0);
  *(int *)((long)&in_RDI[2].allocator + 4) = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,6,0);
  in_RDI[2].dims = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,7,1);
  in_RDI[2].w = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,8,0);
  in_RDI[2].h = iVar1;
  iVar1 = ParamDict::get((ParamDict *)in_RSI,9,0);
  in_RDI[2].c = iVar1;
  Mat::Mat((Mat *)&stack0xffffffffffffff68);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58);
  Mat::operator=(in_RSI,in_RDI);
  Mat::~Mat((Mat *)0x16cb8e);
  Mat::~Mat((Mat *)0x16cb98);
  if (*(int *)&in_RDI[2].data % in_RDI[2].w == 0) {
    local_4 = 0;
  }
  else {
    local_4 = -100;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_w = pd.get(4, 0);
    pad_h = pd.get(14, pad_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);
    int8_scale_term = pd.get(8, 0);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    if (num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    return 0;
}